

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.h
# Opt level: O2

void __thiscall PayToAnchor::PayToAnchor(PayToAnchor *this)

{
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  uchar local_1a [2];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a[0] = 'N';
  local_1a[1] = 's';
  __l._M_len = 2;
  __l._M_array = local_1a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,__l,&local_39);
  (this->super_WitnessUnknown).m_version = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->super_WitnessUnknown).m_program,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  local_1a[0] = 'N';
  local_1a[1] = 's';
  __l_00._M_len = 2;
  __l_00._M_array = local_1a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,__l_00,&local_39);
  CScript::IsPayToAnchor(1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PayToAnchor() : WitnessUnknown(1, {0x4e, 0x73}) {
        Assume(CScript::IsPayToAnchor(1, {0x4e, 0x73}));
    }